

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

timestamp_t __thiscall
duckdb::TimeBucket::WidthConvertibleToMonthsBinaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (WidthConvertibleToMonthsBinaryOperator *this,interval_t bucket_width,timestamp_t ts)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  date_t input;
  int right;
  timestamp_t input_00;
  int right_00;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  timestamp_t result;
  timestamp_t local_40;
  string local_38;
  
  input_00.value = bucket_width.micros;
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(input_00);
  if (bVar1) {
    iVar2 = EpochMonths<duckdb::timestamp_t>(input_00);
    right_00 = (int)this;
    right = (int)(0x168 % (long)right_00);
    iVar3 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar2,right);
    iVar4 = iVar3 - iVar3 % right_00;
    if (iVar3 % right_00 != 0 && iVar3 < 0) {
      iVar4 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar4,right_00);
    }
    iVar4 = iVar4 + right;
    iVar3 = iVar4 % 0xc;
    iVar2 = iVar3 + 1;
    if (iVar3 != 0 && -1 >= iVar4) {
      iVar2 = iVar3 + 0xd;
    }
    input = Date::FromDate((iVar3 == 0 || -1 < iVar4) + 0x7b1 + iVar4 / 0xc,iVar2,1);
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(input,&local_40,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_38,(duckdb *)(ulong)(uint)input.days,(date_t)auVar5._8_4_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,&local_38);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input_00,&local_40,false);
    if (!bVar1) {
      auVar6 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_38,(duckdb *)input_00.value,(timestamp_t)auVar6._8_8_);
      InvalidInputException::InvalidInputException(auVar6._0_8_,&local_38);
      __cxa_throw(auVar6._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  return (timestamp_t)local_40.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS));
		}